

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void Cmd_cachesound(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *logicalname;
  int i;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("Usage: cachesound <sound> ...\n");
    return;
  }
  iVar1 = 1;
  while( true ) {
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 <= iVar1) break;
    logicalname = FCommandLine::operator[](argv,iVar1);
    iVar2 = S_FindSound(logicalname);
    if (iVar2 != 0) {
      S_CacheSound(S_sfx.Array + iVar2);
    }
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

CCMD (cachesound)
{
	if (argv.argc() < 2)
	{
		Printf ("Usage: cachesound <sound> ...\n");
		return;
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		FSoundID sfxnum = argv[i];
		if (sfxnum != FSoundID(0))
		{
			S_CacheSound (&S_sfx[sfxnum]);
		}
	}
}